

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_write_plain(Curl_easy *data,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written
                         )

{
  ssize_t sVar1;
  int num;
  connectdata *conn;
  ssize_t *psStack_30;
  CURLcode result;
  ssize_t *written_local;
  size_t len_local;
  void *mem_local;
  Curl_easy *pCStack_10;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  psStack_30 = written;
  written_local = (ssize_t *)len;
  len_local = (size_t)mem;
  mem_local._4_4_ = sockfd;
  pCStack_10 = data;
  sVar1 = Curl_send_plain(data,(uint)(sockfd == data->conn->sock[1]),mem,len,
                          (CURLcode *)((long)&conn + 4));
  *psStack_30 = sVar1;
  return conn._4_4_;
}

Assistant:

CURLcode Curl_write_plain(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          const void *mem,
                          size_t len,
                          ssize_t *written)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  int num;
  DEBUGASSERT(conn);
  num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *written = Curl_send_plain(data, num, mem, len, &result);

  return result;
}